

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

MaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_max(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x104) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x104;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    MaxLayerParams::MaxLayerParams(this_00.max_);
    (this->layer_).max_ = (MaxLayerParams *)this_00;
  }
  return (MaxLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::MaxLayerParams* NeuralNetworkLayer::mutable_max() {
  if (!has_max()) {
    clear_layer();
    set_has_max();
    layer_.max_ = new ::CoreML::Specification::MaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.max)
  return layer_.max_;
}